

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

uint gvr::anon_unknown_1::findOrStoreVertex
               (Mesh *mesh,
               set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
               *vni,int *vn,Vector3f *v,Vector3f *normal)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  float *pfVar5;
  uint *puVar6;
  bool bVar7;
  _Base_ptr *pp_Var8;
  _Rb_tree_node_base *p_Var9;
  uint uVar10;
  VertexNormalIndex *extraout_RDX;
  VertexNormalIndex *extraout_RDX_00;
  VertexNormalIndex *extraout_RDX_01;
  VertexNormalIndex *extraout_RDX_02;
  long lVar11;
  _Base_ptr *pp_Var12;
  _Base_ptr p_Var13;
  undefined1 auVar14 [16];
  VertexNormalIndex local_78;
  Mesh *local_58;
  uint *local_50;
  undefined1 local_48 [16];
  
  uVar3 = *vn;
  local_78.x = v->v[0];
  local_78.y = v->v[1];
  local_78.z = (float)((ulong)*(undefined8 *)(v->v + 1) >> 0x20);
  local_48 = ZEXT416((uint)v->v[0]);
  local_78.nx = normal->v[0];
  local_78.ny = (float)*(undefined8 *)(normal->v + 1);
  local_78.nz = (float)((ulong)*(undefined8 *)(normal->v + 1) >> 0x20);
  p_Var1 = &(vni->_M_t)._M_impl.super__Rb_tree_header;
  pp_Var12 = &(vni->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  pp_Var8 = pp_Var12;
  p_Var13 = &p_Var1->_M_header;
  local_78.index = uVar3;
  local_58 = mesh;
  local_50 = (uint *)vn;
  while (p_Var4 = *pp_Var8, p_Var4 != (_Base_ptr)0x0) {
    bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)(p_Var4 + 1),&local_78
                       ,(VertexNormalIndex *)vn);
    if (!bVar7) {
      p_Var13 = p_Var4;
    }
    vn = (int *)extraout_RDX;
    pp_Var8 = &p_Var4->_M_left + bVar7;
  }
  if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
     (bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                        ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)&local_78,
                         (VertexNormalIndex *)(p_Var13 + 1),(VertexNormalIndex *)vn),
     vn = (int *)extraout_RDX_00, !bVar7)) {
    return *(uint *)&p_Var13[1]._M_right;
  }
  bVar7 = true;
  p_Var13 = &p_Var1->_M_header;
  while( true ) {
    puVar6 = local_50;
    auVar14._8_8_ = vn;
    auVar14._0_8_ = p_Var13;
    p_Var4 = *pp_Var12;
    if (p_Var4 == (_Base_ptr)0x0) break;
    bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)&local_78,
                       (VertexNormalIndex *)(p_Var4 + 1),(VertexNormalIndex *)vn);
    pp_Var12 = &p_Var4->_M_left + !bVar7;
    vn = (int *)extraout_RDX_01;
    p_Var13 = p_Var4;
  }
  if (bVar7 == false) {
LAB_00127758:
    bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)(auVar14._0_8_ + 0x20)
                       ,&local_78,auVar14._8_8_);
    vn = (int *)extraout_RDX_02;
    uVar10 = uVar3;
    if (!bVar7) goto LAB_001277d0;
  }
  else if (p_Var13 != (vni->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
    auVar14 = std::_Rb_tree_decrement(p_Var13);
    goto LAB_00127758;
  }
  if (p_Var1 == (_Rb_tree_header *)p_Var13) {
    bVar7 = true;
  }
  else {
    bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)&local_78,
                       (VertexNormalIndex *)(p_Var13 + 1),(VertexNormalIndex *)vn);
  }
  p_Var9 = (_Rb_tree_node_base *)operator_new(0x40);
  *(ulong *)(p_Var9 + 1) = CONCAT44(local_78.y,local_78.x);
  p_Var9[1]._M_parent = (_Base_ptr)CONCAT44(local_78.nx,local_78.z);
  *(ulong *)((long)&p_Var9[1]._M_parent + 4) = CONCAT44(local_78.ny,local_78.nx);
  *(ulong *)((long)&p_Var9[1]._M_left + 4) = CONCAT44(local_78.index,local_78.nz);
  std::_Rb_tree_insert_and_rebalance(bVar7,p_Var9,p_Var13,&p_Var1->_M_header);
  psVar2 = &(vni->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  uVar10 = *puVar6;
  local_48 = ZEXT416((uint)v->v[0]);
LAB_001277d0:
  pfVar5 = (local_58->super_PointCloud).vertex;
  lVar11 = (long)(int)(uVar10 * 3);
  pfVar5[lVar11] = (float)local_48._0_4_;
  pfVar5[lVar11 + 1] = v->v[1];
  pfVar5[lVar11 + 2] = v->v[2];
  *puVar6 = uVar10 + 1;
  return uVar3;
}

Assistant:

unsigned int findOrStoreVertex(Mesh *mesh, std::set<VertexNormalIndex> &vni,
  int &vn, const gmath::Vector3f &v, const gmath::Vector3f &normal)
{
  // try to find point v in the vertex list of mesh, but it is only considered
  // a duplicate if the normals are the same


  VertexNormalIndex p(v, normal, vn);
  std::set<VertexNormalIndex>::iterator it=vni.find(p);

  // add the vertex, if a duplicate cannot be found

  if (it != vni.end())
  {
    return it->index;
  }
  else
  {
    vni.insert(p);
    mesh->setVertex(vn, v);
    vn++;

    return p.index;
  }
}